

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O1

Token __thiscall Lexer::tokenType(Lexer *this)

{
  _Elt_pointer pTVar1;
  _Map_pointer ppTVar2;
  _Map_pointer ppTVar3;
  bool bVar4;
  bool bVar5;
  bool local_a;
  bool local_9;
  
  pTVar1 = (this->m_tokenPosition)._M_cur;
  ppTVar2 = (this->m_tokenPosition)._M_node;
  ppTVar3 = (this->m_tokens)._deque.
            super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  bVar4 = ppTVar2 < ppTVar3;
  if (ppTVar2 == ppTVar3) {
    bVar4 = pTVar1 < (this->m_tokens)._deque.
                     super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_cur;
  }
  if (bVar4) {
    ppTVar3 = (this->m_tokens)._deque.
              super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    bVar5 = ppTVar3 <= ppTVar2;
    if (ppTVar2 == ppTVar3) {
      bVar5 = (this->m_tokens)._deque.
              super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur <= pTVar1;
    }
    if (bVar5) goto LAB_0011a211;
  }
  if (bVar4) {
    ppTVar3 = (this->m_tokens)._deque.
              super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    local_9 = ppTVar3 <= ppTVar2;
    if (ppTVar2 == ppTVar3) {
      local_9 = (this->m_tokens)._deque.
                super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur <= pTVar1;
    }
  }
  else {
    local_9 = false;
  }
  local_a = true;
  error<bool,bool>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/lexer.h:86: hasValidToken() (%1) does not equal true (%2)"
                   ,&local_9,&local_a);
LAB_0011a211:
  return ((this->m_tokenPosition)._M_cur)->type;
}

Assistant:

inline Token tokenType() const
	{
		return token()->type;
	}